

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt2obj.cpp
# Opt level: O0

void pbrt::writeObject(SP *object,affine3f *instanceXfm)

{
  bool bVar1;
  ostream *poVar2;
  element_type *peVar3;
  element_type *peVar4;
  size_type sVar5;
  element_type *peVar6;
  SP *in_RSI;
  shared_ptr<pbrt::Instance> inst;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
  *__range1_1;
  SP mesh;
  shared_ptr<pbrt::Shape> shape;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_> *__range1;
  vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
  *in_stack_fffffffffffffe88;
  shared_ptr<pbrt::Instance> *in_stack_fffffffffffffe90;
  ostream *in_stack_fffffffffffffea8;
  affine3f *in_stack_fffffffffffffef8;
  affine3f *in_stack_ffffffffffffff00;
  affine3f *in_stack_ffffffffffffff08;
  SP *in_stack_ffffffffffffff10;
  shared_ptr<pbrt::Instance> local_d0;
  shared_ptr<pbrt::Instance> *local_c0;
  __normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
  local_b8;
  vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
  *local_b0;
  string local_a8 [48];
  __shared_ptr local_78 [32];
  shared_ptr<pbrt::Shape> *local_58;
  __normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
  local_50;
  vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_> *local_48;
  string local_30 [24];
  affine3f *in_stack_ffffffffffffffe8;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"writing ");
  peVar3 = std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x10d0be);
  (**(peVar3->super_Entity)._vptr_Entity)();
  poVar2 = std::operator<<(poVar2,local_30);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  peVar3 = std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x10d116);
  local_48 = &peVar3->shapes;
  local_50._M_current =
       (shared_ptr<pbrt::Shape> *)
       std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>::
       begin((vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_> *
             )in_stack_fffffffffffffe88);
  local_58 = (shared_ptr<pbrt::Shape> *)
             std::
             vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>::
             end((vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                  *)in_stack_fffffffffffffe88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
                        *)in_stack_fffffffffffffe90,
                       (__normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
                        *)in_stack_fffffffffffffe88);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
    ::operator*(&local_50);
    std::shared_ptr<pbrt::Shape>::shared_ptr
              ((shared_ptr<pbrt::Shape> *)in_stack_fffffffffffffe90,
               (shared_ptr<pbrt::Shape> *)in_stack_fffffffffffffe88);
    std::dynamic_pointer_cast<pbrt::TriangleMesh,pbrt::Shape>
              ((shared_ptr<pbrt::Shape> *)in_stack_fffffffffffffea8);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_78);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout," - found mesh w/ ");
      peVar4 = std::
               __shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x10d1d9);
      sVar5 = std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::size
                        (&peVar4->index);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar5);
      poVar2 = std::operator<<(poVar2," tris");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::shared_ptr<pbrt::TriangleMesh>::shared_ptr
                ((shared_ptr<pbrt::TriangleMesh> *)in_stack_fffffffffffffe90,
                 (shared_ptr<pbrt::TriangleMesh> *)in_stack_fffffffffffffe88);
      writeTriangleMesh(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      std::shared_ptr<pbrt::TriangleMesh>::~shared_ptr((shared_ptr<pbrt::TriangleMesh> *)0x10d262);
    }
    else {
      in_stack_fffffffffffffea8 =
           std::operator<<((ostream *)&std::cout," - warning: shape is not a triangle mesh : ");
      peVar6 = std::__shared_ptr_access<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x10d2f3);
      (**(peVar6->super_Entity)._vptr_Entity)(local_a8);
      poVar2 = std::operator<<(in_stack_fffffffffffffea8,local_a8);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_a8);
    }
    std::shared_ptr<pbrt::TriangleMesh>::~shared_ptr((shared_ptr<pbrt::TriangleMesh> *)0x10d373);
    std::shared_ptr<pbrt::Shape>::~shared_ptr((shared_ptr<pbrt::Shape> *)0x10d380);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
    ::operator++(&local_50);
  }
  peVar3 = std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x10d3bb);
  local_b0 = &peVar3->instances;
  local_b8._M_current =
       (shared_ptr<pbrt::Instance> *)
       std::
       vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>::
       begin(in_stack_fffffffffffffe88);
  local_c0 = (shared_ptr<pbrt::Instance> *)
             std::
             vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
             ::end(in_stack_fffffffffffffe88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
                        *)in_stack_fffffffffffffe90,
                       (__normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
                        *)in_stack_fffffffffffffe88);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
    ::operator*(&local_b8);
    in_stack_fffffffffffffe90 = &local_d0;
    std::shared_ptr<pbrt::Instance>::shared_ptr
              (in_stack_fffffffffffffe90,(shared_ptr<pbrt::Instance> *)in_stack_fffffffffffffe88);
    std::__shared_ptr_access<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x10d43b);
    std::shared_ptr<pbrt::Object>::shared_ptr
              ((shared_ptr<pbrt::Object> *)in_stack_fffffffffffffe90,
               (shared_ptr<pbrt::Object> *)in_stack_fffffffffffffe88);
    std::__shared_ptr_access<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x10d466);
    math::operator*(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    writeObject(in_RSI,in_stack_ffffffffffffffe8);
    std::shared_ptr<pbrt::Object>::~shared_ptr((shared_ptr<pbrt::Object> *)0x10d49f);
    std::shared_ptr<pbrt::Instance>::~shared_ptr((shared_ptr<pbrt::Instance> *)0x10d4ac);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
    ::operator++(&local_b8);
  }
  return;
}

Assistant:

void writeObject(Object::SP object, 
                   const affine3f &instanceXfm)
  {
    cout << "writing " << object->toString() << endl;
    for (auto shape : object->shapes) {
      TriangleMesh::SP mesh = std::dynamic_pointer_cast<TriangleMesh>(shape);
      if (mesh) {
        std::cout << " - found mesh w/ " << mesh->index.size() << " tris" << std::endl;
        writeTriangleMesh(mesh,instanceXfm);
      } else
        std::cout << " - warning: shape is not a triangle mesh : " << shape->toString() << std::endl;
    }
      
    for (auto inst : object->instances) {
      writeObject(inst->object,
                  instanceXfm*inst->xfm);
    }
  }